

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

char * cast_node_set_to_string(lyxp_set *set,lyd_node *cur_node,lys_module *param_3,int options)

{
  uint uVar1;
  char *str;
  lyxp_node_type root_type;
  int options_local;
  lys_module *local_mod_local;
  lyd_node *cur_node_local;
  lyxp_set *set_local;
  
  str._4_4_ = options;
  _root_type = param_3;
  local_mod_local = (lys_module *)cur_node;
  cur_node_local = (lyd_node *)set;
  if ((((set->val).nodes)->type == LYXP_NODE_ATTR) ||
     ((((set->val).nodes)->node->validity & 0x80) == 0)) {
    moveto_get_root(cur_node,options,(lyxp_node_type *)&str);
    uVar1 = *(uint *)&cur_node_local->attr->next;
    if (uVar1 < 2) {
      set_local = (lyxp_set *)
                  cast_string_elem(cur_node_local->attr->parent,_root_type,1,(lyxp_node_type)str);
    }
    else if (uVar1 - 2 < 2) {
      set_local = (lyxp_set *)
                  cast_string_elem(cur_node_local->attr->parent,_root_type,0,(lyxp_node_type)str);
    }
    else if (uVar1 == 4) {
      set_local = (lyxp_set *)strdup((char *)cur_node_local->attr->parent->prev);
      if (set_local == (lyxp_set *)0x0) {
        ly_log(_root_type->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
               "cast_node_set_to_string");
      }
    }
    else {
      ly_log(_root_type->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
             ,0x234);
      set_local = (lyxp_set *)0x0;
    }
  }
  else {
    ly_vlog(param_3->ctx,LYE_XPATH_DUMMY,LY_VLOG_LYD,((set->val).nodes)->node,
            ((set->val).nodes)->node->schema->name);
    set_local = (lyxp_set *)0x0;
  }
  return (char *)set_local;
}

Assistant:

static char *
cast_node_set_to_string(struct lyxp_set *set, struct lyd_node *cur_node, struct lys_module *local_mod, int options)
{
    enum lyxp_node_type root_type;
    char *str;

    if ((set->val.nodes[0].type != LYXP_NODE_ATTR) && (set->val.nodes[0].node->validity & LYD_VAL_INUSE)) {
        LOGVAL(local_mod->ctx, LYE_XPATH_DUMMY, LY_VLOG_LYD, set->val.nodes[0].node, set->val.nodes[0].node->schema->name);
        return NULL;
    }

    moveto_get_root(cur_node, options, &root_type);

    switch (set->val.nodes[0].type) {
    case LYXP_NODE_ROOT:
    case LYXP_NODE_ROOT_CONFIG:
        return cast_string_elem(set->val.nodes[0].node, local_mod, 1, root_type);
    case LYXP_NODE_ELEM:
    case LYXP_NODE_TEXT:
        return cast_string_elem(set->val.nodes[0].node, local_mod, 0, root_type);
    case LYXP_NODE_ATTR:
        str = strdup(set->val.attrs[0].attr->value_str);
        if (!str) {
            LOGMEM(local_mod->ctx);
        }
        return str;
    }

    LOGINT(local_mod->ctx);
    return NULL;
}